

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall TPZEqnArray<float>::TPZEqnArray(TPZEqnArray<float> *this)

{
  TPZVec<int>::TPZVec((TPZVec<int> *)&this->fEqStart,0);
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore =
       (this->fEqStart).super_TPZManVector<int,_100>.fExtAlloc;
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements = 0;
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNAlloc = 0;
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019a2398;
  TPZVec<int>::TPZVec((TPZVec<int> *)&this->fEqNumber,0);
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore =
       (this->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc;
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements = 0;
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fNAlloc = 0;
  (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019a2398;
  TPZVec<float>::TPZVec((TPZVec<float> *)&this->fEqValues,0);
  (this->fEqValues).super_TPZManVector<float,_1000>.super_TPZVec<float>.fStore =
       (this->fEqValues).super_TPZManVector<float,_1000>.fExtAlloc;
  (this->fEqValues).super_TPZManVector<float,_1000>.super_TPZVec<float>.fNElements = 0;
  (this->fEqValues).super_TPZManVector<float,_1000>.super_TPZVec<float>.fNAlloc = 0;
  (this->fEqValues).super_TPZManVector<float,_1000>.super_TPZVec<float>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019a2448;
  TPZVec<int>::TPZVec((TPZVec<int> *)&this->fIndex,0);
  (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore =
       (this->fIndex).super_TPZManVector<int,_1000>.fExtAlloc;
  (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fNElements = 0;
  (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fNAlloc = 0;
  (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019a24f8;
  (*(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec[3])
            (&this->fEqStart,
             (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + 1);
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore
  [(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + -1] = 0;
  this->fLastTerm = 0;
  this->fSymmetric = EIsUndefined;
  this->fNumEq = 0;
  return;
}

Assistant:

TPZEqnArray<TVar>::TPZEqnArray() : fEqStart(), fEqNumber(), fEqValues(), fIndex() {
	fEqStart.Push(0);
	fNumEq=0;
	fLastTerm=0;
	fSymmetric=EIsUndefined;
	
}